

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O3

void vkt::ubo::anon_unknown_0::generateCompareSrc
               (ostringstream *src,char *resultVar,VarType *type,string *srcName,string *apiName,
               UniformLayout *layout,int blockNdx,void *basePtr,deUint32 unusedMask,
               MatrixLoadFlags matrixLoadFlag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  DataType dataType;
  pointer pcVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  long lVar7;
  int *resultVar_00;
  char *pcVar8;
  UniformLayoutEntry *entry;
  size_t sVar9;
  ostream *poVar10;
  size_type *psVar11;
  int iVar12;
  undefined8 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  uint uVar15;
  ulong *puVar16;
  undefined4 in_stack_0000000c;
  MatrixLoadFlags MVar17;
  string elementApiName;
  string local_230;
  string op;
  string fullApiName;
  string elementSrcName;
  ios_base local_138 [264];
  
  if (*(int *)resultVar == 0) {
    bVar4 = false;
    resultVar_00 = (int *)resultVar;
  }
  else {
    if (*(int *)resultVar != 1) {
      lVar7 = *(long *)(resultVar + 8);
      puVar16 = *(ulong **)(lVar7 + 0x20);
      if (puVar16 == *(ulong **)(lVar7 + 0x28)) {
        return;
      }
      paVar14 = &elementApiName.field_2;
      do {
        if (((uint)puVar16[7] & (uint)basePtr) == 0) {
          op._M_dataplus._M_p = (pointer)&op.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&op,".","");
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)&op,*puVar16);
          psVar11 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar11) {
            elementSrcName.field_2._M_allocated_capacity = *psVar11;
            elementSrcName.field_2._8_8_ = plVar6[3];
            elementSrcName._M_dataplus._M_p = (pointer)&elementSrcName.field_2;
          }
          else {
            elementSrcName.field_2._M_allocated_capacity = *psVar11;
            elementSrcName._M_dataplus._M_p = (pointer)*plVar6;
          }
          elementSrcName._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op._M_dataplus._M_p != &op.field_2) {
            operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
          }
          elementApiName._M_dataplus._M_p = (pointer)paVar14;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&elementApiName,*(long *)type,
                     (long)&((type->m_data).array.elementType)->m_type + *(long *)type);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&elementApiName,(ulong)elementSrcName._M_dataplus._M_p
                                     );
          op._M_dataplus._M_p = (pointer)&op.field_2;
          psVar11 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar11) {
            op.field_2._M_allocated_capacity = *psVar11;
            op.field_2._8_8_ = plVar6[3];
          }
          else {
            op.field_2._M_allocated_capacity = *psVar11;
            op._M_dataplus._M_p = (pointer)*plVar6;
          }
          op._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)elementApiName._M_dataplus._M_p != paVar14) {
            operator_delete(elementApiName._M_dataplus._M_p,
                            elementApiName.field_2._M_allocated_capacity + 1);
          }
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          pcVar3 = (srcName->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar3,pcVar3 + srcName->_M_string_length);
          MVar17 = 0x69c3f2;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_230,(ulong)elementSrcName._M_dataplus._M_p);
          psVar11 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar11) {
            elementApiName.field_2._M_allocated_capacity = *psVar11;
            elementApiName.field_2._8_8_ = plVar6[3];
            elementApiName._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            elementApiName.field_2._M_allocated_capacity = *psVar11;
            elementApiName._M_dataplus._M_p = (pointer)*plVar6;
          }
          elementApiName._M_string_length = plVar6[1];
          *plVar6 = (long)psVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            MVar17 = 0x69c450;
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          generateCompareSrc(src,(char *)(puVar16 + 4),(VarType *)&op,&elementApiName,apiName,
                             (UniformLayout *)((ulong)layout & 0xffffffff),blockNdx,
                             (void *)((ulong)basePtr & 0xffffffff),0,MVar17);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)elementApiName._M_dataplus._M_p != paVar14) {
            operator_delete(elementApiName._M_dataplus._M_p,
                            elementApiName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)op._M_dataplus._M_p != &op.field_2) {
            operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)elementSrcName._M_dataplus._M_p != &elementSrcName.field_2) {
            operator_delete(elementSrcName._M_dataplus._M_p,
                            elementSrcName.field_2._M_allocated_capacity + 1);
          }
          lVar7 = *(long *)(resultVar + 8);
        }
        puVar16 = puVar16 + 8;
      } while (puVar16 != *(ulong **)(lVar7 + 0x28));
      return;
    }
    resultVar_00 = *(int **)(resultVar + 8);
    if (*resultVar_00 != 0) {
      if (*(int *)(resultVar + 0x10) < 1) {
        return;
      }
      paVar14 = &local_230.field_2;
      paVar1 = &elementApiName.field_2;
      iVar12 = 0;
      do {
        local_230._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"[","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&elementSrcName);
        std::ostream::operator<<(&elementSrcName,iVar12);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&elementSrcName);
        std::ios_base::~ios_base(local_138);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar14) {
          uVar13 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < fullApiName._M_string_length + local_230._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fullApiName._M_dataplus._M_p != &fullApiName.field_2) {
            uVar13 = fullApiName.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < fullApiName._M_string_length + local_230._M_string_length)
          goto LAB_0069bf3b;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&fullApiName,0,(char *)0x0,(ulong)local_230._M_dataplus._M_p);
        }
        else {
LAB_0069bf3b:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)fullApiName._M_dataplus._M_p);
        }
        psVar11 = puVar5 + 2;
        if ((size_type *)*puVar5 == psVar11) {
          elementApiName.field_2._M_allocated_capacity = *psVar11;
          elementApiName.field_2._8_8_ = puVar5[3];
          elementApiName._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          elementApiName.field_2._M_allocated_capacity = *psVar11;
          elementApiName._M_dataplus._M_p = (pointer)*puVar5;
        }
        elementApiName._M_string_length = puVar5[1];
        *puVar5 = psVar11;
        puVar5[1] = 0;
        *(char *)psVar11 = '\0';
        plVar6 = (long *)std::__cxx11::string::append((char *)&elementApiName);
        op._M_dataplus._M_p = (pointer)&op.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar11) {
          op.field_2._M_allocated_capacity = *psVar11;
          op.field_2._8_8_ = plVar6[3];
        }
        else {
          op.field_2._M_allocated_capacity = *psVar11;
          op._M_dataplus._M_p = (pointer)*plVar6;
        }
        op._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)elementApiName._M_dataplus._M_p != paVar1) {
          operator_delete(elementApiName._M_dataplus._M_p,
                          elementApiName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fullApiName._M_dataplus._M_p != &fullApiName.field_2) {
          operator_delete(fullApiName._M_dataplus._M_p,fullApiName.field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar14) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        elementApiName._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&elementApiName,*(long *)type,
                   (long)&((type->m_data).array.elementType)->m_type + *(long *)type);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&elementApiName,(ulong)op._M_dataplus._M_p);
        elementSrcName._M_dataplus._M_p = (pointer)&elementSrcName.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar11) {
          elementSrcName.field_2._M_allocated_capacity = *psVar11;
          elementSrcName.field_2._8_8_ = plVar6[3];
        }
        else {
          elementSrcName.field_2._M_allocated_capacity = *psVar11;
          elementSrcName._M_dataplus._M_p = (pointer)*plVar6;
        }
        elementSrcName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)elementApiName._M_dataplus._M_p != paVar1) {
          operator_delete(elementApiName._M_dataplus._M_p,
                          elementApiName.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = (srcName->_M_dataplus)._M_p;
        local_230._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,pcVar3,pcVar3 + srcName->_M_string_length);
        MVar17 = 0x69c114;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_230,(ulong)op._M_dataplus._M_p);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar11) {
          elementApiName.field_2._M_allocated_capacity = *psVar11;
          elementApiName.field_2._8_8_ = plVar6[3];
          elementApiName._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          elementApiName.field_2._M_allocated_capacity = *psVar11;
          elementApiName._M_dataplus._M_p = (pointer)*plVar6;
        }
        elementApiName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar14) {
          MVar17 = 0x69c175;
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        generateCompareSrc(src,(char *)resultVar_00,(VarType *)&elementSrcName,&elementApiName,
                           apiName,(UniformLayout *)((ulong)layout & 0xffffffff),blockNdx,
                           (void *)((ulong)basePtr & 0xffffffff),0,MVar17);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)elementApiName._M_dataplus._M_p != paVar1) {
          operator_delete(elementApiName._M_dataplus._M_p,
                          elementApiName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)elementSrcName._M_dataplus._M_p != &elementSrcName.field_2) {
          operator_delete(elementSrcName._M_dataplus._M_p,
                          elementSrcName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op._M_dataplus._M_p != &op.field_2) {
          operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
        }
        iVar12 = iVar12 + 1;
        if (*(int *)(resultVar + 0x10) <= iVar12) {
          return;
        }
      } while( true );
    }
    bVar4 = true;
  }
  dataType = resultVar_00[2];
  pcVar8 = glu::getDataTypeName(dataType);
  elementSrcName._M_dataplus._M_p = (pointer)&elementSrcName.field_2;
  pcVar3 = (srcName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&elementSrcName,pcVar3,pcVar3 + srcName->_M_string_length);
  plVar6 = (long *)std::__cxx11::string::append((char *)&elementSrcName);
  fullApiName._M_dataplus._M_p = (pointer)&fullApiName.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    fullApiName.field_2._M_allocated_capacity = *psVar11;
    fullApiName.field_2._8_8_ = plVar6[3];
  }
  else {
    fullApiName.field_2._M_allocated_capacity = *psVar11;
    fullApiName._M_dataplus._M_p = (pointer)*plVar6;
  }
  paVar14 = &elementSrcName.field_2;
  fullApiName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementSrcName._M_dataplus._M_p != paVar14) {
    operator_delete(elementSrcName._M_dataplus._M_p,elementSrcName.field_2._M_allocated_capacity + 1
                   );
  }
  iVar12 = UniformLayout::getUniformLayoutIndex((UniformLayout *)apiName,(int)layout,&fullApiName);
  entry = (UniformLayoutEntry *)((long)iVar12 * 0x40 + *(long *)((long)&apiName->field_2 + 8));
  if (bVar4) {
    if (0 < *(int *)(resultVar + 0x10)) {
      iVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)src,"\tresult *= compare_",0x13);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar8,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"(",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)src,*(char **)type,(long)(type->m_data).array.elementType);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"], ",3);
        generateValueSrc(src,entry,(void *)CONCAT44(in_stack_0000000c,blockNdx),iVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,");\n",3);
        iVar12 = iVar12 + 1;
      } while (iVar12 < *(int *)(resultVar + 0x10));
    }
    goto LAB_0069cf4d;
  }
  if (unusedMask == 0) {
    pcVar8 = glu::getDataTypeName(dataType);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\tresult *= compare_",0x13);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"(",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)src,*(char **)type,(long)(type->m_data).array.elementType);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
    generateValueSrc(src,entry,(void *)CONCAT44(in_stack_0000000c,blockNdx),0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,");\n",3);
    goto LAB_0069cf4d;
  }
  uVar15 = dataType - TYPE_FLOAT_MAT2;
  if (8 < uVar15) goto LAB_0069cf4d;
  elementSrcName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
  elementSrcName._M_string_length = 8;
  elementSrcName.field_2._8_8_ = elementSrcName.field_2._8_8_ & 0xffffffffffffff00;
  elementSrcName._M_dataplus._M_p = (pointer)paVar14;
  switch(uVar15) {
  case 0:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = op.field_2._8_8_ & 0xffffffffffffff00;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x32636576;
    writeMatrixTypeSrc(2,2,&op,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 1:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x33636576;
    writeMatrixTypeSrc(2,3,&op,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 2:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x34636576;
    writeMatrixTypeSrc(2,4,&op,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  default:
    goto switchD_0069c75e_caseD_3;
  case 5:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x34636576;
    writeMatrixTypeSrc(3,4,&op,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 6:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x32636576;
    writeMatrixTypeSrc(4,2,&op,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 7:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x33636576;
    writeMatrixTypeSrc(4,3,&op,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
    break;
  case 8:
    op._M_dataplus._M_p = (pointer)&op.field_2;
    op.field_2._M_allocated_capacity = 0x5f657261706d6f63;
    op._M_string_length = 8;
    op.field_2._8_8_ = (ulong)(uint7)op.field_2._9_7_ << 8;
    elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
    elementApiName._M_string_length = 4;
    elementApiName.field_2._M_allocated_capacity._0_5_ = 0x34636576;
    writeMatrixTypeSrc(4,4,&op,&elementApiName,src,(string *)type,
                       (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementApiName._M_dataplus._M_p != &elementApiName.field_2) {
    operator_delete(elementApiName._M_dataplus._M_p,elementApiName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
  }
switchD_0069c75e_caseD_3:
  paVar14 = &elementSrcName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementSrcName._M_dataplus._M_p != paVar14) {
    operator_delete(elementSrcName._M_dataplus._M_p,elementSrcName.field_2._M_allocated_capacity + 1
                   );
  }
  elementSrcName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
  elementSrcName._M_string_length = 8;
  elementSrcName.field_2._8_8_ = elementSrcName.field_2._8_8_ & 0xffffffffffffff00;
  paVar1 = &op.field_2;
  op.field_2._M_allocated_capacity._0_6_ = 0x74616f6c66;
  op._M_string_length = 5;
  op._M_dataplus._M_p = (pointer)paVar1;
  elementSrcName._M_dataplus._M_p = (pointer)paVar14;
  if (uVar15 < 9) {
    puVar2 = (undefined1 *)((long)&op.field_2 + 5);
    switch(uVar15) {
    case 0:
      elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
      elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
      elementApiName._M_string_length = 8;
      elementApiName.field_2._8_8_ = elementApiName.field_2._8_8_ & 0xffffffffffffff00;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_230,paVar1,puVar2);
      writeMatrixTypeSrc(2,2,&elementApiName,&local_230,src,(string *)type,
                         (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
      break;
    case 1:
      elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
      elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
      elementApiName._M_string_length = 8;
      elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_230,paVar1,puVar2);
      writeMatrixTypeSrc(2,3,&elementApiName,&local_230,src,(string *)type,
                         (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
      break;
    case 2:
      elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
      elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
      elementApiName._M_string_length = 8;
      elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_230,paVar1,puVar2);
      writeMatrixTypeSrc(2,4,&elementApiName,&local_230,src,(string *)type,
                         (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
      break;
    default:
      goto switchD_0069cc05_caseD_3;
    case 5:
      elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
      elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
      elementApiName._M_string_length = 8;
      elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_230,paVar1,puVar2);
      writeMatrixTypeSrc(3,4,&elementApiName,&local_230,src,(string *)type,
                         (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
      break;
    case 6:
      elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
      elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
      elementApiName._M_string_length = 8;
      elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_230,paVar1,puVar2);
      writeMatrixTypeSrc(4,2,&elementApiName,&local_230,src,(string *)type,
                         (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
      break;
    case 7:
      elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
      elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
      elementApiName._M_string_length = 8;
      elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_230,paVar1,puVar2);
      writeMatrixTypeSrc(4,3,&elementApiName,&local_230,src,(string *)type,
                         (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
      break;
    case 8:
      elementApiName._M_dataplus._M_p = (pointer)&elementApiName.field_2;
      elementApiName.field_2._M_allocated_capacity = 0x5f657261706d6f63;
      elementApiName._M_string_length = 8;
      elementApiName.field_2._8_8_ = (ulong)(uint7)elementApiName.field_2._9_7_ << 8;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_230,paVar1,puVar2);
      writeMatrixTypeSrc(4,4,&elementApiName,&local_230,src,(string *)type,
                         (void *)CONCAT44(in_stack_0000000c,blockNdx),entry,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)elementApiName._M_dataplus._M_p != &elementApiName.field_2) {
      operator_delete(elementApiName._M_dataplus._M_p,
                      elementApiName.field_2._M_allocated_capacity + 1);
    }
  }
switchD_0069cc05_caseD_3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != paVar1) {
    operator_delete(op._M_dataplus._M_p,op.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elementSrcName._M_dataplus._M_p != &elementSrcName.field_2) {
    operator_delete(elementSrcName._M_dataplus._M_p,elementSrcName.field_2._M_allocated_capacity + 1
                   );
  }
LAB_0069cf4d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fullApiName._M_dataplus._M_p != &fullApiName.field_2) {
    operator_delete(fullApiName._M_dataplus._M_p,fullApiName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream&	src,
						 const char*			resultVar,
						 const VarType&			type,
						 const std::string&		srcName,
						 const std::string&		apiName,
						 const UniformLayout&	layout,
						 int					blockNdx,
						 const void*			basePtr,
						 deUint32				unusedMask,
						 MatrixLoadFlags		matrixLoadFlag)
{
	if (type.isBasicType() || (type.isArrayType() && type.getElementType().isBasicType()))
	{
		// Basic type or array of basic types.
		bool						isArray			= type.isArrayType();
		glu::DataType				elementType		= isArray ? type.getElementType().getBasicType() : type.getBasicType();
		const char*					typeName		= glu::getDataTypeName(elementType);
		std::string					fullApiName		= std::string(apiName) + (isArray ? "[0]" : ""); // Arrays are always postfixed with [0]
		int							uniformNdx		= layout.getUniformLayoutIndex(blockNdx, fullApiName);
		const UniformLayoutEntry&	entry			= layout.uniforms[uniformNdx];

		if (isArray)
		{
			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
			{
				src << "\tresult *= compare_" << typeName << "(" << srcName << "[" << elemNdx << "], ";
				generateValueSrc(src, entry, basePtr, elemNdx);
				src << ");\n";
			}
		}
		else
		{
			generateSingleCompare(src, elementType, srcName, basePtr, entry, matrixLoadFlag);
		}
	}
	else if (type.isArrayType())
	{
		const VarType& elementType = type.getElementType();

		for (int elementNdx = 0; elementNdx < type.getArraySize(); elementNdx++)
		{
			std::string op = std::string("[") + de::toString(elementNdx) + "]";
			std::string elementSrcName = std::string(srcName) + op;
			std::string elementApiName = std::string(apiName) + op;
			generateCompareSrc(src, resultVar, elementType, elementSrcName, elementApiName, layout, blockNdx, basePtr, unusedMask, LOAD_FULL_MATRIX);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
		{
			if (memberIter->getFlags() & unusedMask)
				continue; // Skip member.

			std::string op = std::string(".") + memberIter->getName();
			std::string memberSrcName = std::string(srcName) + op;
			std::string memberApiName = std::string(apiName) + op;
			generateCompareSrc(src, resultVar, memberIter->getType(), memberSrcName, memberApiName, layout, blockNdx, basePtr, unusedMask, LOAD_FULL_MATRIX);
		}
	}
}